

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O1

void __thiscall ON_SectionStyle::SetBoundaryWidthScale(ON_SectionStyle *this,double scale)

{
  ON_Color OVar1;
  ON_SectionStylePrivate *pOVar2;
  ON_SectionStylePrivate *pOVar3;
  
  pOVar2 = this->m_private;
  pOVar3 = &DefaultSectionStylePrivate;
  if (pOVar2 != (ON_SectionStylePrivate *)0x0) {
    pOVar3 = pOVar2;
  }
  if (2.220446049250313e-16 <= ABS(pOVar3->m_boundary_width_scale - scale)) {
    if (pOVar2 == (ON_SectionStylePrivate *)0x0) {
      pOVar2 = (ON_SectionStylePrivate *)operator_new(0x50);
      pOVar2->m_background_fill_mode = None;
      pOVar2->m_fill_rule = ClosedCurves;
      *(undefined2 *)&pOVar2->field_0x2 = 0;
      pOVar2->m_hatch_index = 0;
      pOVar2->m_hatch_scale = 0.0;
      pOVar2->m_hatch_rotation = 0.0;
      pOVar2->m_background_fill_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar2->m_background_fill_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar2->m_boundary_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar2->m_boundary_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar2->m_hatch_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar2->m_hatch_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      *(undefined8 *)&pOVar2->m_boundary_visible = 0;
      pOVar2->m_boundary_width_scale = 0.0;
      (pOVar2->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pOVar2->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pOVar2->m_background_fill_mode = Viewport;
      pOVar2->m_fill_rule = ClosedCurves;
      pOVar2->m_hatch_index = -0x7fffffff;
      pOVar2->m_hatch_scale = 1.0;
      pOVar2->m_hatch_rotation = 0.0;
      OVar1 = ON_Color::UnsetColor;
      (pOVar2->m_background_fill_color).field_0 = ON_Color::UnsetColor.field_0;
      (pOVar2->m_background_fill_print_color).field_0 = OVar1.field_0;
      (pOVar2->m_boundary_color).field_0 = OVar1.field_0;
      (pOVar2->m_boundary_print_color).field_0 = OVar1.field_0;
      (pOVar2->m_hatch_color).field_0 = OVar1.field_0;
      (pOVar2->m_hatch_print_color).field_0 = OVar1.field_0;
      pOVar2->m_boundary_visible = true;
      pOVar2->m_boundary_width_scale = 3.0;
      (pOVar2->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pOVar2->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this->m_private = pOVar2;
    }
    this->m_private->m_boundary_width_scale = scale;
  }
  return;
}

Assistant:

double ON_SectionStyle::BoundaryWidthScale() const
{
  return m_private ? m_private->m_boundary_width_scale : DefaultSectionStylePrivate.m_boundary_width_scale;
}